

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParameterizedTestSuiteInfo<SignedLongLong> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<SignedLongLong>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeId pvVar3;
  ParameterizedTestSuiteInfo<SignedLongLong> *local_b8;
  undefined1 local_a9;
  CodeLocation local_a8;
  CodeLocation local_70;
  reference local_48;
  ParameterizedTestSuiteInfoBase **test_suite_info;
  iterator __end3;
  iterator __begin3;
  TestSuiteInfoContainer *__range3;
  ParameterizedTestSuiteInfo<SignedLongLong> *typed_test_info;
  CodeLocation *code_location_local;
  char *test_suite_name_local;
  ParameterizedTestSuiteRegistry *this_local;
  
  __range3 = (TestSuiteInfoContainer *)0x0;
  __end3 = std::
           vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
           ::begin(&this->test_suite_infos_);
  test_suite_info =
       (ParameterizedTestSuiteInfoBase **)
       std::
       vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
       ::end(&this->test_suite_infos_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
                                *)&test_suite_info);
    if (!bVar1) {
LAB_001933dd:
      if (__range3 == (TestSuiteInfoContainer *)0x0) {
        __range3 = (TestSuiteInfoContainer *)operator_new(0x80);
        local_a9 = 1;
        CodeLocation::CodeLocation(&local_a8,code_location);
        ParameterizedTestSuiteInfo<SignedLongLong>::ParameterizedTestSuiteInfo
                  ((ParameterizedTestSuiteInfo<SignedLongLong> *)__range3,test_suite_name,&local_a8)
        ;
        local_a9 = 0;
        CodeLocation::~CodeLocation(&local_a8);
        local_b8 = (ParameterizedTestSuiteInfo<SignedLongLong> *)__range3;
        std::
        vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
        ::push_back(&this->test_suite_infos_,(value_type *)&local_b8);
      }
      return (ParameterizedTestSuiteInfo<SignedLongLong> *)__range3;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
               ::operator*(&__end3);
    iVar2 = (*(*local_48)->_vptr_ParameterizedTestSuiteInfoBase[2])();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var,iVar2),test_suite_name);
    if (bVar1) {
      iVar2 = (*(*local_48)->_vptr_ParameterizedTestSuiteInfoBase[3])();
      pvVar3 = GetTypeId<SignedLongLong>();
      if ((TypeId)CONCAT44(extraout_var_00,iVar2) != pvVar3) {
        CodeLocation::CodeLocation(&local_70,code_location);
        ReportInvalidTestSuiteType(test_suite_name,&local_70);
        CodeLocation::~CodeLocation(&local_70);
        posix::Abort();
      }
      __range3 = (TestSuiteInfoContainer *)
                 CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<SignedLongLong>,testing::internal::ParameterizedTestSuiteInfoBase>
                           (*local_48);
      goto LAB_001933dd;
    }
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite> >(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }